

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::portmap_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,portmap_error_alert *this)

{
  error_category *peVar1;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"could not map port using ",&local_b9);
  std::operator+(&local_78,&local_38,
                 *(char **)((anonymous_namespace)::nat_type_str + (ulong)this->map_transport * 8));
  std::operator+(&local_58,&local_78,": ");
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_b8,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_98,&local_b8);
  std::operator+(__return_storage_ptr__,&local_58,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string portmap_error_alert::message() const
	{
		return std::string("could not map port using ")
			+ nat_type_str[static_cast<int>(map_transport)]
			+ ": " + convert_from_native(error.message());
	}